

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::InputSource::InputSource
          (InputSource *this,XMLCh *systemId,XMLCh *publicId,MemoryManager *manager)

{
  XMLCh *pXVar1;
  
  this->_vptr_InputSource = (_func_int **)&PTR__InputSource_00404b20;
  this->fMemoryManager = manager;
  this->fEncoding = (XMLCh *)0x0;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fFatalErrorIfNotFound = true;
  pXVar1 = XMLString::replicate(publicId,manager);
  this->fPublicId = pXVar1;
  pXVar1 = XMLString::replicate(systemId,this->fMemoryManager);
  this->fSystemId = pXVar1;
  return;
}

Assistant:

InputSource::InputSource(const  XMLCh* const   systemId
                        , const XMLCh* const   publicId
                        , MemoryManager* const manager) :

    fMemoryManager(manager)
    , fEncoding(0)
    , fPublicId(0)
    , fSystemId(0)
    , fFatalErrorIfNotFound(true)
{
    fPublicId = XMLString::replicate(publicId, fMemoryManager);
    fSystemId = XMLString::replicate(systemId, fMemoryManager);
}